

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

void __thiscall amrex::ClusterList::ClusterList(ClusterList *this,IntVect *pts,Long len)

{
  IntVect *a;
  Long in_RDI;
  Cluster *in_stack_ffffffffffffffd0;
  
  std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::list
            ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)0x18e12f9);
  a = (IntVect *)operator_new(0x30);
  Cluster::Cluster(in_stack_ffffffffffffffd0,a,in_RDI);
  std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::push_back
            ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)in_stack_ffffffffffffffd0,
             (value_type *)a);
  return;
}

Assistant:

ClusterList::ClusterList (IntVect* pts, Long len)
{
    lst.push_back(new Cluster(pts,len));
}